

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicResourceAtomicCounter::RunIteration
          (BasicResourceAtomicCounter *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  bool bVar1;
  GLuint GVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  uint *puVar10;
  void *pvVar11;
  GLuint *value;
  GLuint i;
  bool ret;
  GLuint *data;
  GLuint kSize;
  GLint kDepth;
  GLint kHeight;
  GLint kWidth;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceAtomicCounter *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  glcts::(anonymous_namespace)::BasicResourceAtomicCounter::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    uVar5 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    uVar7 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    uVar3 = uVar3 * uVar4 * uVar5 * uVar6 * uVar7 * uVar8;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,(ulong)uVar3 << 3,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    if (this->m_counter_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_counter_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0,this->m_counter_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,8,(void *)0x0,0x88e0);
    puVar9 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,4,2);
    *puVar9 = 0;
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0);
    puVar10 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,0x92c0,4,4,2);
    *puVar10 = uVar3;
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar5 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar6 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar4,uVar5,uVar6);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      puVar10 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,puVar10,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pvVar11 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x90d2,0,(ulong)uVar3 << 2,1);
    bVar1 = true;
    for (value._0_4_ = 0; (uint)value < uVar3; value._0_4_ = (uint)value + 1) {
      if (*(uint *)((long)pvVar11 + (ulong)(uint)value * 4) != (uint)value) {
        anon_unknown_0::Output
                  ("Value at index %d is %d should be %d.\n",(ulong)(uint)value,
                   (ulong)*(uint *)((long)pvVar11 + (ulong)(uint)value * 4),(ulong)(uint)value);
        bVar1 = false;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,this->m_counter_buffer);
    puVar10 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,0x92c0,0,8,1);
    if (*puVar10 != uVar3) {
      anon_unknown_0::Output
                ("Final atomic counter value (buffer 0, offset 0) is %d should be %d.\n",
                 (ulong)*puVar10,(ulong)uVar3);
      bVar1 = false;
    }
    if (puVar10[1] != 0) {
      anon_unknown_0::Output
                ("Final atomic counter value (buffer 0, offset 4) is %d should be %d.\n",
                 (ulong)puVar10[1],0);
      bVar1 = false;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0);
    this_local._7_1_ = bVar1;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kSize * 2, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_counter_buffer == 0)
			glGenBuffers(1, &m_counter_buffer);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 2 * sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), GL_MAP_WRITE_BIT)) = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		*static_cast<GLuint*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), sizeof(GLuint), GL_MAP_WRITE_BIT)) = kSize;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kSize, GL_MAP_READ_BIT));

		bool ret = true;
		for (GLuint i = 0; i < kSize; ++i)
		{
			if (data[i] != i)
			{
				Output("Value at index %d is %d should be %d.\n", i, data[i], i);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		GLuint* value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer);
		value =
			static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 2 * sizeof(GLuint), GL_MAP_READ_BIT));
		if (value[0] != kSize)
		{
			Output("Final atomic counter value (buffer 0, offset 0) is %d should be %d.\n", value[0], kSize);
			ret = false;
		}
		if (value[1] != 0)
		{
			Output("Final atomic counter value (buffer 0, offset 4) is %d should be %d.\n", value[1], 0);
			ret = false;
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		return ret;
	}